

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

ATTRIBUTE_ID * getAttributeId(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  KEY pXVar1;
  STRING_POOL *pool;
  XML_Char XVar2;
  DTD *pDVar3;
  XML_Bool XVar4;
  XML_Char *pXVar5;
  ATTRIBUTE_ID *pAVar6;
  PREFIX *pPVar7;
  long lVar8;
  long lVar9;
  
  pDVar3 = parser->m_dtd;
  pool = &pDVar3->pool;
  if (((pDVar3->pool).ptr != (pDVar3->pool).end) || (XVar4 = poolGrow(pool), XVar4 != '\0')) {
    pXVar5 = (pDVar3->pool).ptr;
    (pDVar3->pool).ptr = pXVar5 + 1;
    *pXVar5 = '\0';
    pXVar5 = poolStoreString(pool,enc,start,end);
    if (pXVar5 != (XML_Char *)0x0) {
      pXVar1 = pXVar5 + 1;
      pAVar6 = (ATTRIBUTE_ID *)lookup(parser,&pDVar3->attributeIds,pXVar1,0x18);
      if (pAVar6 != (ATTRIBUTE_ID *)0x0) {
        if (pAVar6->name != pXVar1) {
          (pDVar3->pool).ptr = (pDVar3->pool).start;
          return pAVar6;
        }
        (pDVar3->pool).start = (pDVar3->pool).ptr;
        if (parser->m_ns == '\0') {
          return pAVar6;
        }
        if ((((*pXVar1 == 'x') && (pXVar5[2] == 'm')) && (pXVar5[3] == 'l')) &&
           ((pXVar5[4] == 'n' && (pXVar5[5] == 's')))) {
          if (pXVar5[6] == ':') {
            pPVar7 = (PREFIX *)lookup(parser,&pDVar3->prefixes,pXVar5 + 7,0x10);
LAB_001724d7:
            pAVar6->prefix = pPVar7;
            pAVar6->xmlns = '\x01';
            return pAVar6;
          }
          if (pXVar5[6] == '\0') {
            pPVar7 = &pDVar3->defaultPrefix;
            goto LAB_001724d7;
          }
        }
        lVar9 = 0;
        while( true ) {
          if (pXVar1[lVar9] == '\0') {
            return pAVar6;
          }
          if (pXVar1[lVar9] == ':') break;
          lVar9 = lVar9 + 1;
        }
        if (lVar9 != 0) {
          lVar8 = 0;
          do {
            if (((pDVar3->pool).ptr == (pDVar3->pool).end) &&
               (XVar4 = poolGrow(pool), XVar4 == '\0')) {
              return (ATTRIBUTE_ID *)0x0;
            }
            XVar2 = pXVar1[lVar8];
            pXVar5 = (pDVar3->pool).ptr;
            (pDVar3->pool).ptr = pXVar5 + 1;
            *pXVar5 = XVar2;
            lVar8 = lVar8 + 1;
          } while (lVar9 != lVar8);
        }
        if (((pDVar3->pool).ptr != (pDVar3->pool).end) || (XVar4 = poolGrow(pool), XVar4 != '\0')) {
          pXVar5 = (pDVar3->pool).ptr;
          (pDVar3->pool).ptr = pXVar5 + 1;
          *pXVar5 = '\0';
          pPVar7 = (PREFIX *)lookup(parser,&pDVar3->prefixes,(pDVar3->pool).start,0x10);
          pAVar6->prefix = pPVar7;
          if (pPVar7 != (PREFIX *)0x0) {
            pXVar1 = (pDVar3->pool).start;
            if (pPVar7->name == pXVar1) {
              (pDVar3->pool).start = (pDVar3->pool).ptr;
              return pAVar6;
            }
            (pDVar3->pool).ptr = pXVar1;
            return pAVar6;
          }
        }
      }
    }
  }
  return (ATTRIBUTE_ID *)0x0;
}

Assistant:

static ATTRIBUTE_ID *
getAttributeId(XML_Parser parser, const ENCODING *enc, const char *start,
               const char *end) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  ATTRIBUTE_ID *id;
  const XML_Char *name;
  if (! poolAppendChar(&dtd->pool, XML_T('\0')))
    return NULL;
  name = poolStoreString(&dtd->pool, enc, start, end);
  if (! name)
    return NULL;
  /* skip quotation mark - its storage will be reused (like in name[-1]) */
  ++name;
  id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, name,
                              sizeof(ATTRIBUTE_ID));
  if (! id)
    return NULL;
  if (id->name != name)
    poolDiscard(&dtd->pool);
  else {
    poolFinish(&dtd->pool);
    if (! parser->m_ns)
      ;
    else if (name[0] == XML_T(ASCII_x) && name[1] == XML_T(ASCII_m)
             && name[2] == XML_T(ASCII_l) && name[3] == XML_T(ASCII_n)
             && name[4] == XML_T(ASCII_s)
             && (name[5] == XML_T('\0') || name[5] == XML_T(ASCII_COLON))) {
      if (name[5] == XML_T('\0'))
        id->prefix = &dtd->defaultPrefix;
      else
        id->prefix = (PREFIX *)lookup(parser, &dtd->prefixes, name + 6,
                                      sizeof(PREFIX));
      id->xmlns = XML_TRUE;
    } else {
      int i;
      for (i = 0; name[i]; i++) {
        /* attributes without prefix are *not* in the default namespace */
        if (name[i] == XML_T(ASCII_COLON)) {
          int j;
          for (j = 0; j < i; j++) {
            if (! poolAppendChar(&dtd->pool, name[j]))
              return NULL;
          }
          if (! poolAppendChar(&dtd->pool, XML_T('\0')))
            return NULL;
          id->prefix = (PREFIX *)lookup(parser, &dtd->prefixes,
                                        poolStart(&dtd->pool), sizeof(PREFIX));
          if (! id->prefix)
            return NULL;
          if (id->prefix->name == poolStart(&dtd->pool))
            poolFinish(&dtd->pool);
          else
            poolDiscard(&dtd->pool);
          break;
        }
      }
    }
  }
  return id;
}